

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

size_t defaultPrevCharLen(char *buf,size_t param_2,size_t pos,size_t *col_len)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RAX;
  int end;
  uint uVar3;
  size_t sVar4;
  size_t len;
  unsigned_long cp_00;
  int cp;
  undefined8 uStack_38;
  
  sVar4 = pos;
  uStack_38 = in_RAX;
  do {
    if (sVar4 == 0) {
      return 0;
    }
    uVar3 = (uint)sVar4;
    uVar2 = (int)uVar3 >> 0x1f & uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    len = (size_t)(int)(uVar3 - (uVar2 - 1));
    sVar4 = sVar4 - len;
    utf8BytesToCodePoint(buf + sVar4,len,(int *)((long)&uStack_38 + 4));
    cp_00 = (unsigned_long)uStack_38._4_4_;
    bVar1 = isCombiningChar(cp_00);
  } while (bVar1);
  if (col_len != (size_t *)0x0) {
    bVar1 = isWideChar(cp_00);
    *col_len = (ulong)bVar1 + 1;
  }
  return pos - sVar4;
}

Assistant:

static size_t defaultPrevCharLen(const char * buf, size_t /*buf_len*/, size_t pos, size_t * col_len) {
    size_t end = pos;
    while (pos > 0) {
        size_t len = prevUtf8CodePointLen(buf, pos);
        pos -= len;
        int cp;
        utf8BytesToCodePoint(buf + pos, len, &cp);
        if (!isCombiningChar(cp)) {
            if (col_len != NULL) {
                *col_len = isWideChar(cp) ? 2 : 1;
            }
            return end - pos;
        }
    }
    /* NOTREACHED */
    return 0;
}